

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

int Bus_SclCompareFanouts(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  float fVar1;
  float fVar2;
  float Espilon;
  Abc_Obj_t **pp2_local;
  Abc_Obj_t **pp1_local;
  
  fVar1 = Bus_SclObjETime(*pp1);
  fVar2 = Bus_SclObjETime(*pp2);
  if (fVar2 - 0.0 <= fVar1) {
    fVar1 = Bus_SclObjETime(*pp1);
    fVar2 = Bus_SclObjETime(*pp2);
    if (fVar1 <= fVar2 + 0.0) {
      fVar1 = Bus_SclObjCin(*pp1);
      fVar2 = Bus_SclObjCin(*pp2);
      if (fVar1 <= fVar2) {
        fVar1 = Bus_SclObjCin(*pp1);
        fVar2 = Bus_SclObjCin(*pp2);
        if (fVar2 <= fVar1) {
          pp1_local._4_4_ = -1;
        }
        else {
          pp1_local._4_4_ = 1;
        }
      }
      else {
        pp1_local._4_4_ = -1;
      }
    }
    else {
      pp1_local._4_4_ = 1;
    }
  }
  else {
    pp1_local._4_4_ = -1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Bus_SclCompareFanouts( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    float Espilon = 0;//10; // 10 ps
    if ( Bus_SclObjETime(*pp1) < Bus_SclObjETime(*pp2) - Espilon )
        return -1;
    if ( Bus_SclObjETime(*pp1) > Bus_SclObjETime(*pp2) + Espilon )
        return 1;
    if ( Bus_SclObjCin(*pp1) > Bus_SclObjCin(*pp2) )
        return -1;
    if ( Bus_SclObjCin(*pp1) < Bus_SclObjCin(*pp2) )
        return 1;
    return -1;
}